

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

uint32 setup_obs(uint32 ts,uint32 strm,uint32 n_frame,uint32 n_stream,uint32 *veclen,uint32 blksize)

{
  int iVar1;
  void *buf;
  void *ptr;
  ulong uVar2;
  ulong uVar3;
  long ln;
  uint uVar4;
  uint uVar5;
  uint32 uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32 n_i_frame;
  undefined8 local_60;
  uint32 local_58;
  uint local_54;
  ulong local_50;
  size_t local_48;
  ulong local_40;
  uint32 local_34;
  
  local_40 = (ulong)strm;
  uVar7 = veclen[local_40];
  uVar3 = (ulong)uVar7;
  vlen = uVar7;
  if (multiclass == '\x01') {
    uVar2 = (ulong)ts;
    local_54 = n_frame / stride;
    if ((l_ts != ts) || (l_strm != strm)) {
      n_tot_frame = n_tot_frame + local_54;
      uVar4 = local_54 * uVar7;
      l_ts = ts;
      l_strm = strm;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0x130,"alloc\'ing %uMb obs buf\n",(ulong)(uVar4 >> 0x12));
      if (obuf != (float32 *)0x0) {
        ckd_free(obuf);
        obuf = (float32 *)0x0;
      }
      obuf = (float32 *)
             __ckd_calloc__((ulong)uVar4,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x136);
      if (stride == 1) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x139,"Reading all frames\n");
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x13c,"Reading 1 out of every %u frames from obs dmp file...\n");
      }
      if (o2d == (uint32 **)0x0) {
        uVar8 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x158,"dmp mdef == output mdef\n");
        iVar1 = segdmp_next_feat(ts,(vector_t ***)&local_60,&local_58);
        if (iVar1 != 0) {
          uVar4 = 0;
          uVar8 = 0;
          do {
            if (local_58 != 1) {
              __assert_fail("n_i_frame == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0x15a,"uint32 setup_obs_multiclass(uint32, uint32, uint32, uint32)");
            }
            if (uVar4 % stride == 0) {
              memcpy(obuf + uVar8,
                     *(void **)(*(long *)CONCAT44(local_60._4_4_,(uint32)local_60) + local_40 * 8),
                     uVar3 * 4);
              uVar8 = (ulong)((int)uVar8 + uVar7);
            }
            ckd_free((void *)**(undefined8 **)CONCAT44(local_60._4_4_,(uint32)local_60));
            ckd_free_2d((void *)CONCAT44(local_60._4_4_,(uint32)local_60));
            uVar4 = uVar4 + 1;
            iVar1 = segdmp_next_feat(ts,(vector_t ***)&local_60,&local_58);
          } while (iVar1 != 0);
        }
      }
      else {
        uVar8 = 0;
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x140,"o_ts == %u ->",uVar2);
        if (n_o2d[uVar2] != 0) {
          uVar9 = 0;
          do {
            err_msg(ERR_INFOCONT,(char *)0x0,0," %d",(ulong)o2d[uVar2][uVar9]);
            uVar9 = uVar9 + 1;
          } while (uVar9 < n_o2d[uVar2]);
        }
        err_msg(ERR_INFOCONT,(char *)0x0,0,"\n");
        if (n_o2d[uVar2] != 0) {
          local_48 = uVar3 * 4;
          uVar9 = 0;
          uVar8 = 0;
          local_50 = uVar2;
          do {
            uVar6 = o2d[local_50][uVar9];
            iVar1 = segdmp_next_feat(uVar6,(vector_t ***)&local_60,&local_58);
            if (iVar1 != 0) {
              uVar4 = 0;
              do {
                if (local_58 != 1) {
                  __assert_fail("n_i_frame == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                                ,0x14a,"uint32 setup_obs_multiclass(uint32, uint32, uint32, uint32)"
                               );
                }
                if (uVar4 % stride == 0) {
                  memcpy(obuf + uVar8,
                         *(void **)(*(long *)CONCAT44(local_60._4_4_,(uint32)local_60) +
                                   local_40 * 8),local_48);
                  uVar8 = (ulong)((int)uVar8 + uVar7);
                }
                ckd_free((void *)**(undefined8 **)CONCAT44(local_60._4_4_,(uint32)local_60));
                ckd_free_2d((void *)CONCAT44(local_60._4_4_,(uint32)local_60));
                uVar4 = uVar4 + 1;
                iVar1 = segdmp_next_feat(uVar6,(vector_t ***)&local_60,&local_58);
              } while (iVar1 != 0);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < n_o2d[local_50]);
        }
      }
      uVar7 = local_54;
      if ((uint)(uVar8 / uVar3) != local_54) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                ,0x169,"Expected %u frames, but read %u\n",(ulong)local_54,uVar8 / uVar3);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0x16c,"done reading %u frames\n",(ulong)uVar7);
      return uVar7;
    }
    ln = 0x126;
  }
  else {
    local_60._0_4_ = 0;
    uVar4 = n_frame / stride;
    if (l_strm != strm) {
      local_50 = CONCAT44(local_50._4_4_,n_stream);
      local_48 = CONCAT44(local_48._4_4_,n_frame);
      n_tot_frame = n_tot_frame + uVar4;
      uVar6 = 0;
      l_strm = strm;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
              ,0xed,"alloc\'ing %uMb obs buf\n",(ulong)(uVar4 * uVar7 >> 0x12));
      if (obuf != (float32 *)0x0) {
        ckd_free(obuf);
        obuf = (float32 *)0x0;
      }
      local_54 = uVar4;
      obuf = (float32 *)
             __ckd_calloc__((ulong)(veclen[local_40] * uVar4),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                            ,0xf3);
      buf = __ckd_calloc__((ulong)blksize,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                           ,0xf5);
      uVar3 = local_50 & 0xffffffff;
      ptr = __ckd_calloc__(uVar3,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                           ,0xf6);
      if ((int)local_50 != 0) {
        uVar2 = 0;
        uVar8 = 0;
        do {
          *(void **)((long)ptr + uVar2 * 8) = (void *)(uVar8 * 4 + (long)buf);
          uVar6 = (int)uVar8 + veclen[uVar2];
          uVar8 = (ulong)uVar6;
          uVar2 = uVar2 + 1;
        } while (uVar3 != uVar2);
      }
      if (uVar6 != blksize) {
        __assert_fail("l == blksize",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                      ,0xfc,"uint32 setup_obs_1class(uint32, uint32, uint32, uint32 *, uint32)");
      }
      uVar7 = (uint)local_48;
      if (dmp_fp == (FILE *)0x0) {
        __assert_fail("dmp_fp != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                      ,0xfd,"uint32 setup_obs_1class(uint32, uint32, uint32, uint32 *, uint32)");
      }
      iVar1 = fseek((FILE *)dmp_fp,data_offset,0);
      if (-1 < iVar1) {
        if (uVar7 != 0) {
          uVar4 = 0;
          uVar5 = 0;
          local_34 = blksize;
          do {
            uVar6 = bio_fread(buf,4,blksize,dmp_fp,dmp_swp,(uint32 *)&local_60);
            uVar3 = local_40;
            if (uVar6 != blksize) {
              err_msg_system(ERR_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                             ,0x107,"Can\'t read dump file\n");
              return 0;
            }
            if (uVar5 % stride == 0) {
              memcpy(obuf + uVar4,*(void **)((long)ptr + local_40 * 8),(ulong)veclen[local_40] << 2)
              ;
              uVar4 = uVar4 + veclen[uVar3];
              blksize = local_34;
              uVar7 = (uint)local_48;
            }
            uVar5 = uVar5 + 1;
          } while (uVar7 != uVar5);
        }
        ckd_free(buf);
        ckd_free(ptr);
        return local_54;
      }
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                     ,0x100,"Can\'t seek to start of data\n");
      return 0;
    }
    ln = 0xe3;
  }
  uVar7 = n_frame / stride;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
          ,ln,"No need to read data; using existing buffered data\n");
  return uVar7;
}

Assistant:

uint32
setup_obs(uint32 ts, uint32 strm, uint32 n_frame, uint32 n_stream, uint32 *veclen, uint32 blksize)
{
    vlen = veclen[strm];
    if (multiclass) {
	return setup_obs_multiclass(ts, strm, n_frame, veclen[strm]);
    }
    else {
	return setup_obs_1class(strm, n_frame, n_stream, veclen, blksize);
    }
}